

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::objectivec::SingleFieldGenerator::WantsHasProperty
          (SingleFieldGenerator *this)

{
  FieldDescriptor *pFVar1;
  
  pFVar1 = (this->super_FieldGenerator).descriptor_;
  if (*(long *)(pFVar1 + 0x60) != 0) {
    return false;
  }
  return *(int *)(*(long *)(pFVar1 + 0x30) + 0x8c) != 3;
}

Assistant:

bool SingleFieldGenerator::WantsHasProperty(void) const {
  if (descriptor_->containing_oneof() != NULL) {
    // If in a oneof, it uses the oneofcase instead of a has bit.
    return false;
  }
  if (HasFieldPresence(descriptor_->file())) {
    // In proto1/proto2, every field has a has_$name$() method.
    return true;
  }
  return false;
}